

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

vec4 __thiscall rengine::StaticRenderTest::pixel(StaticRenderTest *this,int x,int y)

{
  vec4 vVar1;
  vec4 local_4c;
  vec4 local_3c;
  uint local_2c;
  int local_28;
  uint pixel;
  int y_local;
  int x_local;
  StaticRenderTest *this_local;
  
  local_28 = y;
  pixel = x;
  _y_local = this;
  if (x < 0) {
    __assert_fail("x >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                  ,0x88,"vec4 rengine::StaticRenderTest::pixel(int, int)");
  }
  if (this->m_w <= x) {
    __assert_fail("x < m_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                  ,0x89,"vec4 rengine::StaticRenderTest::pixel(int, int)");
  }
  if (y < 0) {
    __assert_fail("y >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                  ,0x8a,"vec4 rengine::StaticRenderTest::pixel(int, int)");
  }
  if (y < this->m_h) {
    local_2c = this->m_pixels[y * this->m_w + x];
    vec4::vec4(&local_3c,(float)(local_2c & 0xff),(float)(local_2c >> 8 & 0xff),
               (float)((local_2c & 0xff0000) >> 0x10),(float)(local_2c >> 0x18));
    vec4::vec4(&local_4c,255.0);
    vVar1 = vec4::operator/(&local_3c,local_4c);
    return vVar1;
  }
  __assert_fail("y < m_h",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/tests/test.h"
                ,0x8b,"vec4 rengine::StaticRenderTest::pixel(int, int)");
}

Assistant:

vec4 pixel(int x, int y) {
        assert(x >= 0);
        assert(x < m_w);
        assert(y >= 0);
        assert(y < m_h);
        unsigned pixel = m_pixels[y * m_w + x];
        return vec4((pixel & 0x000000ff) >> 0,
                          (pixel & 0x0000ff00) >> 8,
                          (pixel & 0x00ff0000) >> 16,
                          (pixel & 0xff000000) >> 24) / 255.0;
    }